

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void google::protobuf::internal::TcParser::ReportFastUtf8Error
               (uint32_t decoded_tag,TcParseTableBase *table)

{
  FieldEntry *field_entry;
  string_view field_name;
  string_view sVar1;
  string_view sVar2;
  bool in_stack_00000008;
  
  field_entry = FindFieldEntry(table,decoded_tag >> 3);
  sVar1 = MessageName(table);
  sVar2 = FieldName(table,field_entry);
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)sVar2._M_str;
  sVar2._M_str = (char *)sVar2._M_len;
  sVar2._M_len = (size_t)sVar1._M_str;
  PrintUTF8ErrorLog((internal *)sVar1._M_len,sVar2,field_name,(char *)0x0,in_stack_00000008);
  return;
}

Assistant:

void TcParser::ReportFastUtf8Error(uint32_t decoded_tag,
                                   const TcParseTableBase* table) {
  uint32_t field_num = decoded_tag >> 3;
  const auto* entry = FindFieldEntry(table, field_num);
  PrintUTF8ErrorLog(MessageName(table), FieldName(table, entry), "parsing",
                    false);
}